

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

TryEmplaceResult * __thiscall
QHash<QString,QVariant>::tryEmplace_impl<QLatin1String_const&>
          (TryEmplaceResult *__return_storage_ptr__,QHash<QString,QVariant> *this,QLatin1String *key
          )

{
  uchar uVar1;
  uint *puVar2;
  Span *pSVar3;
  storage_type *psVar4;
  char *__s;
  Data<QHashPrivate::Node<QString,_QVariant>_> *pDVar5;
  size_t hash;
  Node<QString,_QVariant> *pNVar7;
  storage_type *psVar8;
  long in_FS_OFFSET;
  bool bVar10;
  QByteArrayView QVar11;
  Bucket BVar12;
  QHash<QString,_QVariant> local_60;
  Data *local_58;
  char16_t *pcStack_50;
  qsizetype local_48;
  long local_38;
  Span *pSVar6;
  ulong uVar9;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)this == 0) {
    pDVar5 = QHashPrivate::Data<QHashPrivate::Node<QString,_QVariant>_>::detached
                       ((Data<QHashPrivate::Node<QString,_QVariant>_> *)0x0);
    *(Data<QHashPrivate::Node<QString,_QVariant>_> **)this = pDVar5;
  }
  local_60.d = (Data *)0x0;
  pDVar5 = *(Data<QHashPrivate::Node<QString,_QVariant>_> **)this;
  hash = qHash(*key,pDVar5->seed);
  BVar12 = QHashPrivate::Data<QHashPrivate::Node<QString,_QVariant>_>::
           findBucketWithHash<QLatin1String>(pDVar5,key,hash);
  uVar9 = BVar12.index;
  pSVar6 = BVar12.span;
  uVar1 = pSVar6->offsets[uVar9];
  puVar2 = *(uint **)this;
  if ((puVar2 == (uint *)0x0) || (1 < *puVar2)) {
LAB_001a9289:
    QHash<QString,_QVariant>::operator=(&local_60,(QHash<QString,_QVariant> *)this);
    if (uVar1 == 0xff) {
      bVar10 = *(ulong *)(*(long *)this + 0x10) >> 1 <= *(ulong *)(*(long *)this + 8);
    }
    else {
      bVar10 = false;
    }
    pDVar5 = *(Data<QHashPrivate::Node<QString,_QVariant>_> **)this;
    pSVar3 = pDVar5->spans;
    if (bVar10) {
      pDVar5 = QHashPrivate::Data<QHashPrivate::Node<QString,_QVariant>_>::detached
                         (pDVar5,pDVar5->size + 1);
    }
    else {
      pDVar5 = QHashPrivate::Data<QHashPrivate::Node<QString,_QVariant>_>::detached(pDVar5);
    }
    *(Data<QHashPrivate::Node<QString,_QVariant>_> **)this = pDVar5;
    if (bVar10) {
      BVar12 = QHashPrivate::Data<QHashPrivate::Node<QString,_QVariant>_>::
               findBucketWithHash<QLatin1String>(pDVar5,key,hash);
    }
    else {
      BVar12.index._0_4_ = (uint)BVar12.index & 0x7f;
      BVar12.span = pDVar5->spans +
                    ((((ulong)((long)pSVar6 - (long)pSVar3) >> 4) * 0x1c71c71c71c71c80 | uVar9) >> 7
                    );
      BVar12.index._4_4_ = 0;
    }
  }
  else {
    if (uVar1 != 0xff) goto LAB_001a93b8;
    if (*(ulong *)(puVar2 + 4) >> 1 <= *(ulong *)(puVar2 + 2)) goto LAB_001a9289;
  }
  if (uVar1 == 0xff) {
    pNVar7 = QHashPrivate::Span<QHashPrivate::Node<QString,_QVariant>_>::insert
                       (BVar12.span,BVar12.index);
    psVar4 = (storage_type *)key->m_size;
    __s = key->m_data;
    psVar8 = (storage_type *)0x0;
    if (0 < (long)psVar4) {
      psVar8 = psVar4;
    }
    if (__s == (char *)0x0) {
      psVar8 = (storage_type *)0x0;
    }
    if (__s != (char *)0x0 && (long)psVar4 < 0) {
      psVar8 = (storage_type *)strlen(__s);
    }
    QVar11.m_data = psVar8;
    QVar11.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar11);
    (pNVar7->key).d.d = local_58;
    (pNVar7->key).d.ptr = pcStack_50;
    (pNVar7->key).d.size = local_48;
    (pNVar7->value).d.data.shared = (PrivateShared *)0x0;
    *(undefined8 *)((long)&(pNVar7->value).d.data + 8) = 0;
    *(undefined8 *)((long)&(pNVar7->value).d.data + 0x10) = 0;
    *(undefined8 *)&(pNVar7->value).d.field_0x18 = 2;
    *(long *)(*(long *)this + 8) = *(long *)(*(long *)this + 8) + 1;
  }
LAB_001a93b8:
  pSVar6 = (*(Data<QHashPrivate::Node<QString,_QVariant>_> **)this)->spans;
  (__return_storage_ptr__->iterator).i.d = *(Data<QHashPrivate::Node<QString,_QVariant>_> **)this;
  (__return_storage_ptr__->iterator).i.bucket =
       ((ulong)((long)BVar12.span - (long)pSVar6) >> 4) * 0x1c71c71c71c71c80 | BVar12.index;
  __return_storage_ptr__->inserted = uVar1 == 0xff;
  QHash<QString,_QVariant>::~QHash(&local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

TryEmplaceResult tryEmplace_impl(K &&key, Args &&...args)
    {
        if (!d)
            detach();
        QHash detachGuard;

        size_t hash = QHashPrivate::calculateHash(key, d->seed);
        typename Data::Bucket bucket = d->findBucketWithHash(key, hash);
        const bool shouldInsert = bucket.isUnused();

        // Even if we don't insert we may have to detach because we are
        // returning a non-const iterator:
        if (!isDetached() || (shouldInsert && d->shouldGrow())) {
            detachGuard = *this;
            const bool resized = shouldInsert && d->shouldGrow();
            const size_t bucketIndex = bucket.toBucketIndex(d);

            // Must detach from detachGuard
            d = resized ? Data::detached(d, d->size + 1) : Data::detached(d);
            bucket = resized ? d->findBucketWithHash(key, hash) : typename Data::Bucket(d, bucketIndex);
        }
        if (shouldInsert) {
            Node *n = bucket.insert();
            using ConstructProxy = typename QHashPrivate::HeterogenousConstructProxy<Key, K>;
            Node::createInPlace(n, ConstructProxy(std::forward<K>(key)),
                                std::forward<Args>(args)...);
            ++d->size;
        }
        return {iterator(bucket.toIterator(d)), shouldInsert};
    }